

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

int Of_SetAddCut(Of_Cut_t **pCuts,int nCuts,int nCutNum)

{
  int nCuts_00;
  int nCutNum_local;
  int nCuts_local;
  Of_Cut_t **pCuts_local;
  
  if (nCuts == 0) {
    pCuts_local._4_4_ = 1;
  }
  else {
    nCuts_00 = Of_SetLastCutContainsArea(pCuts,nCuts);
    Of_SetSortByArea(pCuts,nCuts_00);
    pCuts_local._4_4_ = Abc_MinInt(nCuts_00 + 1,nCutNum + -1);
  }
  return pCuts_local._4_4_;
}

Assistant:

static inline int Of_SetAddCut( Of_Cut_t ** pCuts, int nCuts, int nCutNum )
{
    if ( nCuts == 0 )
        return 1;
    nCuts = Of_SetLastCutContainsArea(pCuts, nCuts);
    Of_SetSortByArea( pCuts, nCuts );
    return Abc_MinInt( nCuts + 1, nCutNum - 1 );
}